

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makemon.c
# Opt level: O0

permonst * rndmonst(level *lev)

{
  ushort uVar1;
  boolean bVar2;
  boolean bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  d_level *dlev_00;
  ushort **ppuVar8;
  long lVar9;
  bool bVar10;
  boolean upper;
  boolean elemlevel;
  int maxmlev;
  int minmlev;
  d_level *dlev;
  int ct;
  int mndx;
  permonst *ptr;
  level *lev_local;
  
  dlev_00 = &lev->z;
  if (((lev->mon_gen == (mon_gen_override *)0x0) ||
      (iVar4 = rn2(100), lev->mon_gen->override_chance <= iVar4)) ||
     (lev_local = (level *)get_override_mon(&lev->z,lev->mon_gen), lev_local == (level *)0x0)) {
    if (rndmonst_state.choice_count < 0) {
      rndmonst_state.choice_count = 0;
      dlev._4_4_ = 0;
      while (((int)dlev._4_4_ < 0x158 && (bVar2 = uncommon(dlev_00,dlev._4_4_), bVar2 != '\0'))) {
        rndmonst_state.mchoices[(int)dlev._4_4_] = '\0';
        dlev._4_4_ = dlev._4_4_ + 1;
      }
      if (dlev._4_4_ == 0x158) {
        return (permonst *)0x0;
      }
      iVar4 = min_monster_difficulty(dlev_00);
      iVar5 = max_monster_difficulty(dlev_00);
      bVar2 = on_level(dlev_00,&dungeon_topology.d_rogue_level);
      bVar10 = false;
      if (dlev_00->dnum == dungeon_topology.d_astral_level.dnum) {
        bVar3 = on_level(dlev_00,&dungeon_topology.d_astral_level);
        bVar10 = bVar3 == '\0';
      }
      for (; (int)dlev._4_4_ < 0x158; dlev._4_4_ = dlev._4_4_ + 1) {
        lVar9 = (long)(int)dlev._4_4_;
        rndmonst_state.mchoices[(int)dlev._4_4_] = '\0';
        if (((((iVar4 <= monstr[(int)dlev._4_4_]) && (monstr[(int)dlev._4_4_] <= iVar5)) &&
             ((bVar2 == '\0' ||
              (ppuVar8 = __ctype_b_loc(),
              ((*ppuVar8)[(int)(uint)(byte)""[(int)mons[lVar9].mlet]] & 0x100) != 0)))) &&
            ((((!bVar10 || (bVar3 = wrong_elem_type(dlev_00,mons + lVar9), bVar3 == '\0')) &&
              (bVar3 = uncommon(dlev_00,dlev._4_4_), bVar3 == '\0')) &&
             ((bVar3 = In_hell(dlev_00), bVar3 == '\0' || ((mons[lVar9].geno & 0x800) == 0)))))) &&
           (((mons[lVar9].mflags2 & 0x400000) == 0 ||
            (bVar3 = on_level(dlev_00,&dungeon_topology.d_blackmarket_level), bVar3 == '\0')))) {
          uVar1 = mons[lVar9].geno;
          iVar6 = align_shift(dlev_00,mons + lVar9);
          uVar7 = (uVar1 & 7) + iVar6;
          if (((int)uVar7 < 0) || (0x7f < (int)uVar7)) {
            panic("rndmonst: bad count [#%d: %d]",(ulong)dlev._4_4_,(ulong)uVar7);
          }
          rndmonst_state.choice_count = uVar7 + rndmonst_state.choice_count;
          rndmonst_state.mchoices[(int)dlev._4_4_] = (char)uVar7;
        }
      }
    }
    if (rndmonst_state.choice_count < 1) {
      lev_local = (level *)0x0;
    }
    else {
      dlev._0_4_ = rnd(rndmonst_state.choice_count);
      dlev._4_4_ = 0;
      while (((int)dlev._4_4_ < 0x158 &&
             (dlev._0_4_ = (int)dlev - rndmonst_state.mchoices[(int)dlev._4_4_], 0 < (int)dlev))) {
        dlev._4_4_ = dlev._4_4_ + 1;
      }
      if ((dlev._4_4_ == 0x158) || (bVar2 = uncommon(dlev_00,dlev._4_4_), bVar2 != '\0')) {
        warning("rndmonst: bad `mndx\' [#%d]",(ulong)dlev._4_4_);
        lev_local = (level *)0x0;
      }
      else {
        lev_local = (level *)(mons + (int)dlev._4_4_);
      }
    }
  }
  return (permonst *)lev_local;
}

Assistant:

const struct permonst *rndmonst(struct level *lev)
{
	const struct permonst *ptr;
	int mndx, ct;
	const d_level *dlev = &lev->z;

	if (lev->mon_gen &&
	    rn2(100) < lev->mon_gen->override_chance &&
	    (ptr = get_override_mon(&lev->z, lev->mon_gen)) != NULL)
	    return ptr;

	if (rndmonst_state.choice_count < 0) {	/* need to recalculate */
	    int minmlev, maxmlev;
	    boolean elemlevel;
	    boolean upper;

	    rndmonst_state.choice_count = 0;
	    /* look for first common monster */
	    for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++) {
		if (!uncommon(dlev, mndx)) break;
		rndmonst_state.mchoices[mndx] = 0;
	    }		
	    if (mndx == SPECIAL_PM) {
		/* evidently they've all been exterminated */
		return NULL;
	    } /* else `mndx' now ready for use below */
	    minmlev = min_monster_difficulty(dlev);
	    maxmlev = max_monster_difficulty(dlev);
	    upper = Is_rogue_level(dlev);
	    elemlevel = In_endgame(dlev) && !Is_astralevel(dlev);

/*
 *	Find out how many monsters exist in the range we have selected.
 */
	    /* (`mndx' initialized above) */
	    for ( ; mndx < SPECIAL_PM; mndx++) {
		ptr = &mons[mndx];
		rndmonst_state.mchoices[mndx] = 0;
		if (tooweak(mndx, minmlev) || toostrong(mndx, maxmlev))
		    continue;
		if (upper && !isupper((uchar)def_monsyms[(int)(ptr->mlet)])) continue;
		if (elemlevel && wrong_elem_type(dlev, ptr)) continue;
		if (uncommon(dlev, mndx)) continue;
		if (In_hell(dlev) && (ptr->geno & G_NOHELL)) continue;
		/* SWD: pets are not allowed in the black market */
		if (is_domestic(ptr) && Is_blackmarket(dlev)) continue;
		ct = (int)(ptr->geno & G_FREQ) + align_shift(dlev, ptr);
		if (ct < 0 || ct > 127)
		    panic("rndmonst: bad count [#%d: %d]", mndx, ct);
		rndmonst_state.choice_count += ct;
		rndmonst_state.mchoices[mndx] = (char)ct;
	    }
/*
 *	    Possible modification:  if choice_count is "too low",
 *	    expand minmlev..maxmlev range and try again.
 */
	} /* choice_count+mchoices[] recalc */

	if (rndmonst_state.choice_count <= 0) {
	    /* maybe no common mons left, or all are too weak or too strong */
	    return NULL;
	}

/*
 *	Now, select a monster at random.
 */
	ct = rnd(rndmonst_state.choice_count);
	for (mndx = LOW_PM; mndx < SPECIAL_PM; mndx++)
	    if ((ct -= (int)rndmonst_state.mchoices[mndx]) <= 0) break;

	if (mndx == SPECIAL_PM || uncommon(dlev, mndx)) {	/* shouldn't happen */
	    warning("rndmonst: bad `mndx' [#%d]", mndx);
	    return NULL;
	}
	return &mons[mndx];
}